

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

StringResult<long_long> __thiscall
QCborStreamReader::readStringChunk(QCborStreamReader *this,char *ptr,qsizetype maxlen)

{
  QCborStreamReader QVar1;
  byte bVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ReadStringChunk params;
  StringResult<long_long> SVar9;
  StringResult<long_long> SVar10;
  
  params.maxlen_or_type = maxlen;
  params.field_0.ptr = ptr;
  SVar9 = QCborStreamReaderPrivate::readStringChunk(*(QCborStreamReaderPrivate **)(this + 8),params)
  ;
  if ((SVar9.status == EndOfString) && (plVar4 = *(long **)(this + 8), (int)plVar4[0xc] == 0)) {
    QVar1 = *(QCborStreamReader *)((long)plVar4 + 0x5e);
    this[0x10] = QVar1;
    if (QVar1 == (QCborStreamReader)0xff) {
      if ((*plVar4 != 0) && (plVar4[6] == 0)) {
        QByteArray::clear((QByteArray *)(plVar4 + 1));
        puVar7 = *(undefined8 **)(this + 8);
        if (puVar7[0xd] != 0) {
          QIODevice::skip((QIODevice *)*puVar7,puVar7[0xd]);
          puVar7 = *(undefined8 **)(this + 8);
        }
        puVar7[0xd] = 0;
      }
    }
    else {
      *(undefined4 *)(plVar4 + 0xc) = 0;
      if ((byte)((char)QVar1 + 0xbU) < 3) {
        this[0x10] = (QCborStreamReader)0xe0;
        *(ulong *)this = (ulong)*(byte *)(plVar4[2] + plVar4[0xd]) - 0xe0;
      }
      else {
        bVar2 = *(byte *)((long)plVar4 + 0x5f);
        if ((bVar2 & 2) == 0) {
          uVar8 = (ulong)*(ushort *)((long)plVar4 + 0x5c);
        }
        else {
          lVar5 = *(long *)(plVar4[10] + 0x10);
          lVar6 = *(long *)(plVar4[10] + 0x68);
          if ((bVar2 & 1) == 0) {
            uVar3 = *(uint *)(lVar5 + 1 + lVar6);
            uVar8 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
          }
          else {
            uVar8 = *(ulong *)(lVar5 + 1 + lVar6);
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          }
        }
        *(ulong *)this = uVar8;
        if ((bVar2 & 4) != 0 && QVar1 == (QCborStreamReader)0x0) {
          this[0x10] = (QCborStreamReader)0x20;
        }
      }
    }
  }
  SVar10._12_4_ = 0;
  SVar10.data = SUB128(SVar9._0_12_,0);
  SVar10.status = SUB124(SVar9._0_12_,8);
  return SVar10;
}

Assistant:

QCborStreamReader::StringResult<qsizetype>
QCborStreamReader::readStringChunk(char *ptr, qsizetype maxlen)
{
    auto r = d->readStringChunk({ptr, maxlen});
    if (r.status == EndOfString && lastError() == QCborError::NoError)
        preparse();
    return r;
}